

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O1

string * __thiscall
util::format<char_const*,char_const(&)[29]>
          (string *__return_storage_ptr__,util *this,char *arg,char (*args) [29])

{
  size_type *psVar1;
  undefined8 *puVar2;
  char *arg_00;
  ulong uVar3;
  undefined8 uVar4;
  allocator<char> local_81;
  string local_80;
  ulong *local_60;
  long local_58;
  ulong local_50 [2];
  long *local_40;
  long local_38;
  long local_30 [2];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,(char *)this,&local_81);
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char*>((string *)&local_60,local_40,local_38 + (long)local_40);
  format<char_const*>(&local_80,(util *)arg,arg_00);
  uVar3 = 0xf;
  if (local_60 != local_50) {
    uVar3 = local_50[0];
  }
  if (uVar3 < local_80._M_string_length + local_58) {
    uVar4 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      uVar4 = local_80.field_2._M_allocated_capacity;
    }
    if (local_80._M_string_length + local_58 <= (ulong)uVar4) {
      puVar2 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_80,0,(char *)0x0,(ulong)local_60);
      goto LAB_001617ff;
    }
  }
  puVar2 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_60,(ulong)local_80._M_dataplus._M_p);
LAB_001617ff:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar2 + 2;
  if ((size_type *)*puVar2 == psVar1) {
    uVar4 = puVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar4;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar2[1];
  *puVar2 = psVar1;
  puVar2[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string format(T arg, Args&&... args)
{
    using namespace std; // pull in to_string for other types
    std::string s = to_string(arg) + format(std::forward<Args>(args)...);
    return s;
}